

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractInt::test
          (ShaderBitfieldOperationCaseBitfieldExtractInt *this,Data *data)

{
  int iVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  
  iVar1 = this->m_components;
  bVar6 = iVar1 < 1;
  if (0 < iVar1) {
    cVar3 = (char)data->bits;
    cVar2 = (char)data->offset + cVar3;
    if (data->outIvec4[0] == (data->inIvec4[0] << (-cVar2 & 0x1fU)) >> (-cVar3 & 0x1fU)) {
      lVar7 = 0;
      do {
        iVar8 = (int)lVar7;
        if (iVar1 + -1 == iVar8) break;
        lVar4 = lVar7 + 1;
        lVar5 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while (data->outIvec4[lVar5] ==
               (data->inIvec4[lVar4] << (0x20U - cVar2 & 0x1f)) >> (0x20U - cVar3 & 0x1f));
      bVar6 = iVar1 <= iVar8 + 1;
    }
  }
  return bVar6;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = data->inIvec4[i] << (32 - (data->offset + data->bits));
			expected >>= 32 - data->bits;
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}